

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O1

int mpt::type_properties<mpt::span<mpt::metatype::value<double>_*const>_>::id(bool obtain)

{
  int iVar1;
  uint uVar2;
  type_traits *ptVar3;
  
  if (0 < id::_valtype) {
    return id::_valtype;
  }
  if (metatype::value<double>::pointer_traits(bool)::traits == 0) {
    iVar1 = -3;
  }
  else {
    iVar1 = *(int *)(metatype::value<double>::pointer_traits(bool)::traits + 0x10);
  }
  uVar2 = iVar1 + 0xe0U & 0xff;
  if (0x1a < iVar1 - 0x60U) {
    uVar2 = 0;
  }
  if (uVar2 == 0) {
    if (!obtain) {
      return -3;
    }
    ptVar3 = _dynamic_traits();
    uVar2 = mpt::type_traits::add(ptVar3);
  }
  id::_valtype = uVar2;
  return uVar2;
}

Assistant:

static int id(bool obtain = false) {
		static int _valtype = 0;
		if (_valtype > 0) {
			return _valtype;
		}
		/* use vector IDs for builtin types */
		int type = type_properties<T>::id(false);
		if ((type = MPT_type_toVector(type)) > 0) {
			return _valtype = type;
		}
		if (!obtain) {
			return BadType;
		}
		return _valtype = type_traits::add(*_dynamic_traits());
	}